

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quad.cpp
# Opt level: O0

Vec2d ** __thiscall Quad::getExtremities(Quad *this)

{
  Vec2d *this_00;
  bool bVar1;
  Vec2d **ppVVar2;
  float fVar3;
  float fVar4;
  Vec2d *vec;
  int i;
  bool initialised;
  Vec2d **extremities;
  Quad *this_local;
  
  ppVVar2 = (Vec2d **)operator_new__(0x10);
  bVar1 = false;
  for (vec._0_4_ = 0; (int)vec < this->vertexCount; vec._0_4_ = (int)vec + 1) {
    this_00 = this->vertices[(int)vec];
    if (bVar1) {
      fVar3 = Vec2d::getX(this_00);
      fVar4 = Vec2d::getX(*ppVVar2);
      if (fVar3 <= fVar4) {
        fVar3 = Vec2d::getY(this_00);
        fVar4 = Vec2d::getY(*ppVVar2);
        if (fVar3 <= fVar4) {
          *ppVVar2 = this_00;
        }
      }
      fVar3 = Vec2d::getX(this_00);
      fVar4 = Vec2d::getX(ppVVar2[1]);
      if (fVar4 <= fVar3) {
        fVar3 = Vec2d::getY(this_00);
        fVar4 = Vec2d::getY(ppVVar2[1]);
        if (fVar4 <= fVar3) {
          ppVVar2[1] = this_00;
        }
      }
    }
    else {
      *ppVVar2 = this_00;
      ppVVar2[1] = this_00;
      bVar1 = true;
    }
  }
  return ppVVar2;
}

Assistant:

Vec2d** Quad::getExtremities() {
    Vec2d** extremities = new Vec2d*[2];
    bool initialised = false;
    for (int i = 0; i < vertexCount; i++) {
        Vec2d* vec = vertices[i];
        if (!initialised) {
            extremities[0] = vec;
            extremities[1] = vec;
            initialised = true;
        } else {
            if (vec->getX() <= extremities[0]->getX() && vec->getY() <= extremities[0]->getY()) {
                extremities[0] = vec;
            }
            if (vec->getX() >= extremities[1]->getX() && vec->getY() >= extremities[1]->getY()) {
                extremities[1] = vec;
            }
        }
        vec = nullptr;
    }
    return extremities;
}